

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O0

char * Jinx::Impl::GetUtf8CstrByIndex(String *source,int64_t index)

{
  size_t sVar1;
  char *pcVar2;
  size_type sVar3;
  ulong local_40;
  size_t i;
  char *end;
  char *cstr;
  size_t idx;
  int64_t index_local;
  String *source_local;
  
  sVar1 = GetStringCount(source);
  if ((sVar1 < (ulong)index) || (index == 0)) {
    pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                       (source);
    LogWriteLine(Error,"Attempted to access string %s with out of bounds index %zu",pcVar2,index);
    source_local = (String *)0x0;
  }
  else {
    end = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                    (source);
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                      (source);
    pcVar2 = end + sVar3;
    local_40 = 1;
    for (; end < pcVar2 && local_40 < (ulong)index; end = end + sVar1) {
      sVar1 = GetUtf8CharSize(end);
      local_40 = local_40 + 1;
    }
    source_local = (String *)end;
  }
  return (char *)source_local;
}

Assistant:

inline_t const char * GetUtf8CstrByIndex(const String & source, int64_t index)
	{
		size_t idx = static_cast<size_t>(index);
		if (idx > GetStringCount(source) || idx < 1)
		{
			LogWriteLine(LogLevel::Error, "Attempted to access string %s with out of bounds index %zu", source.c_str(), idx);
			return nullptr;
		}
		const char * cstr = source.c_str();
		const char * end = cstr + source.size();
		size_t i = 1;
		while (cstr < end && i < idx)
		{
			cstr += GetUtf8CharSize(cstr);
			++i;
		}
		return cstr;
	}